

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

MSLConstexprSampler * __thiscall
spirv_cross::CompilerMSL::find_constexpr_sampler(CompilerMSL *this,uint32_t id)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  MSLConstexprSampler *pMVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  key_type local_20;
  
  p_Var1 = &(this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar7]) {
    bVar7 = p_Var3[1]._M_color < id;
    if (!bVar7) {
      p_Var6 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var3 = p_Var6, id < p_Var6[1]._M_color)) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    uVar2 = Compiler::get_decoration((Compiler *)this,(ID)id,DecorationDescriptorSet);
    local_20.binding = Compiler::get_decoration((Compiler *)this,(ID)id,DecorationBinding);
    local_20.desc_set = uVar2;
    cVar4 = ::std::
            _Hashtable<spirv_cross::SetBindingPair,_std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->constexpr_samplers_by_binding)._M_h,&local_20);
    pMVar5 = (MSLConstexprSampler *)
             ((long)cVar4.
                    super__Node_iterator_base<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_true>
                    ._M_cur + 0x10);
    if (cVar4.
        super__Node_iterator_base<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_true>
        ._M_cur == (__node_type *)0x0) {
      pMVar5 = (MSLConstexprSampler *)0x0;
    }
  }
  else {
    pMVar5 = (MSLConstexprSampler *)&p_Var3[1].field_0x4;
  }
  return pMVar5;
}

Assistant:

const MSLConstexprSampler *CompilerMSL::find_constexpr_sampler(uint32_t id) const
{
	// Try by ID.
	{
		auto itr = constexpr_samplers_by_id.find(id);
		if (itr != end(constexpr_samplers_by_id))
			return &itr->second;
	}

	// Try by binding.
	{
		uint32_t desc_set = get_decoration(id, DecorationDescriptorSet);
		uint32_t binding = get_decoration(id, DecorationBinding);

		auto itr = constexpr_samplers_by_binding.find({ desc_set, binding });
		if (itr != end(constexpr_samplers_by_binding))
			return &itr->second;
	}

	return nullptr;
}